

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O1

Matrix * GetCameraProjectionMatrix(Matrix *__return_storage_ptr__,Camera *camera,float aspect)

{
  double dVar1;
  double dVar2;
  float fVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  
  if (camera->projection == 1) {
    fVar3 = camera->fovy * 0.5;
    fVar7 = aspect * fVar3;
    __return_storage_ptr__->m0 = 0.0;
    __return_storage_ptr__->m4 = 0.0;
    __return_storage_ptr__->m8 = 0.0;
    __return_storage_ptr__->m12 = 0.0;
    __return_storage_ptr__->m1 = 0.0;
    __return_storage_ptr__->m5 = 0.0;
    __return_storage_ptr__->m9 = 0.0;
    __return_storage_ptr__->m13 = 0.0;
    __return_storage_ptr__->m2 = 0.0;
    __return_storage_ptr__->m6 = 0.0;
    __return_storage_ptr__->m10 = 0.0;
    __return_storage_ptr__->m14 = 0.0;
    __return_storage_ptr__->m3 = 0.0;
    __return_storage_ptr__->m7 = 0.0;
    __return_storage_ptr__->m11 = 0.0;
    __return_storage_ptr__->m15 = 0.0;
    __return_storage_ptr__->m0 = 2.0 / (fVar7 + fVar7);
    __return_storage_ptr__->m1 = 0.0;
    __return_storage_ptr__->m2 = 0.0;
    __return_storage_ptr__->m3 = 0.0;
    __return_storage_ptr__->m4 = 0.0;
    __return_storage_ptr__->m8 = 0.0;
    __return_storage_ptr__->m5 = 2.0 / (fVar3 + fVar3);
    __return_storage_ptr__->m6 = 0.0;
    __return_storage_ptr__->m10 = -0.0020000201;
    __return_storage_ptr__->m7 = 0.0;
    __return_storage_ptr__->m11 = 0.0;
    __return_storage_ptr__->m9 = 0.0;
    __return_storage_ptr__->m12 = -(fVar7 - fVar7) / (fVar7 + fVar7);
    fVar7 = -(fVar3 - fVar3) / (fVar3 + fVar3);
    uVar8 = 0x3f800000;
    lVar4 = 0x3c;
    uVar9 = 0xbf8000a8;
    lVar5 = 0x2c;
    lVar6 = 0x1c;
  }
  else if (camera->projection == 0) {
    fVar7 = camera->fovy;
    __return_storage_ptr__->m3 = 0.0;
    __return_storage_ptr__->m7 = 0.0;
    __return_storage_ptr__->m11 = 0.0;
    __return_storage_ptr__->m15 = 0.0;
    __return_storage_ptr__->m2 = 0.0;
    __return_storage_ptr__->m6 = 0.0;
    __return_storage_ptr__->m10 = 0.0;
    __return_storage_ptr__->m14 = 0.0;
    __return_storage_ptr__->m1 = 0.0;
    __return_storage_ptr__->m5 = 0.0;
    __return_storage_ptr__->m9 = 0.0;
    __return_storage_ptr__->m13 = 0.0;
    __return_storage_ptr__->m0 = 0.0;
    __return_storage_ptr__->m4 = 0.0;
    __return_storage_ptr__->m8 = 0.0;
    __return_storage_ptr__->m12 = 0.0;
    dVar1 = tan((double)(fVar7 * 0.017453292) * 0.5);
    dVar1 = dVar1 * 0.01;
    dVar2 = (double)aspect * dVar1;
    __return_storage_ptr__->m0 = 0.02 / (float)(dVar2 + dVar2);
    __return_storage_ptr__->m5 = 0.02 / (float)(dVar1 + dVar1);
    __return_storage_ptr__->m8 = ((float)dVar2 - (float)dVar2) / (float)(dVar2 + dVar2);
    __return_storage_ptr__->m9 = ((float)dVar1 - (float)dVar1) / (float)(dVar1 + dVar1);
    uVar8 = 0xbca3d776;
    lVar4 = 0x2c;
    uVar9 = 0xbf800000;
    lVar5 = 0x38;
    fVar7 = -1.00002;
    lVar6 = 0x28;
  }
  else {
    __return_storage_ptr__->m0 = 0.0;
    __return_storage_ptr__->m4 = 0.0;
    __return_storage_ptr__->m8 = 0.0;
    __return_storage_ptr__->m12 = 0.0;
    __return_storage_ptr__->m3 = 0.0;
    __return_storage_ptr__->m7 = 0.0;
    __return_storage_ptr__->m11 = 0.0;
    __return_storage_ptr__->m15 = 0.0;
    __return_storage_ptr__->m2 = 0.0;
    __return_storage_ptr__->m6 = 0.0;
    __return_storage_ptr__->m10 = 0.0;
    __return_storage_ptr__->m14 = 0.0;
    __return_storage_ptr__->m1 = 0.0;
    __return_storage_ptr__->m5 = 0.0;
    __return_storage_ptr__->m9 = 0.0;
    __return_storage_ptr__->m13 = 0.0;
    __return_storage_ptr__->m0 = 1.0;
    lVar4 = 0x3c;
    lVar5 = 0x28;
    fVar7 = 1.0;
    lVar6 = 0x14;
    uVar9 = 0x3f800000;
    uVar8 = 0x3f800000;
  }
  *(float *)((long)&__return_storage_ptr__->m0 + lVar6) = fVar7;
  *(undefined4 *)((long)&__return_storage_ptr__->m0 + lVar5) = uVar9;
  *(undefined4 *)((long)&__return_storage_ptr__->m0 + lVar4) = uVar8;
  return __return_storage_ptr__;
}

Assistant:

Matrix GetCameraProjectionMatrix(Camera *camera, float aspect)
{
    if (camera->projection == CAMERA_PERSPECTIVE)
    {
        return MatrixPerspective(camera->fovy*DEG2RAD, aspect, CAMERA_CULL_DISTANCE_NEAR, CAMERA_CULL_DISTANCE_FAR);
    }
    else if (camera->projection == CAMERA_ORTHOGRAPHIC)
    {
        double top = camera->fovy/2.0;
        double right = top*aspect;

        return MatrixOrtho(-right, right, -top, top, CAMERA_CULL_DISTANCE_NEAR, CAMERA_CULL_DISTANCE_FAR);
    }

    return MatrixIdentity();
}